

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void memory_unmap_x86_64(uc_struct_conflict *uc,MemoryRegion *mr)

{
  uint uVar1;
  MemoryRegion **ppMVar2;
  long lVar3;
  hwaddr addr;
  
  if (uc->cpu != (CPUState *)0x0) {
    if (*(long *)((long)&mr->size + 8) != 0) {
      __assert_fail("r == a",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                    ,0x16,"uint64_t int128_get64(Int128)");
    }
    (*uc->uc_invalidate_tb)(uc,mr->addr,(size_t)mr->size);
    for (addr = mr->addr; mr->end != addr && -1 < (long)(mr->end - addr);
        addr = addr + uc->target_page_size) {
      tlb_flush_page_x86_64(uc->cpu,addr);
    }
  }
  memory_region_del_subregion_x86_64(uc->system_memory,mr);
  uVar1 = uc->mapped_block_count;
  if ((ulong)uVar1 != 0) {
    ppMVar2 = uc->mapped_blocks;
    lVar3 = 0;
    do {
      if (*(MemoryRegion **)((long)ppMVar2 + lVar3) == mr) {
        uc->mapped_block_count = uVar1 - 1;
        memmove((void *)((long)ppMVar2 + lVar3),(void *)((long)ppMVar2 + lVar3 + 8),
                (ulong)(uVar1 - 1) * 8 - lVar3);
        (*mr->destructor)(mr);
        g_free(mr);
        return;
      }
      lVar3 = lVar3 + 8;
    } while ((ulong)uVar1 * 8 - lVar3 != 0);
  }
  return;
}

Assistant:

void memory_unmap(struct uc_struct *uc, MemoryRegion *mr)
{
    hwaddr addr;

    if (uc->cpu) {
        // We also need to remove all tb cache
        uc->uc_invalidate_tb(uc, mr->addr, int128_get64(mr->size));

        // Make sure all pages associated with the MemoryRegion are flushed
        // Only need to do this if we are in a running state
        for (addr = mr->addr; (int64_t)(mr->end - addr) > 0; addr += uc->target_page_size) {
           tlb_flush_page(uc->cpu, addr);
        }
    }
    memory_region_del_subregion(uc->system_memory, mr);
    memory_region_remove_mapped_block(uc, mr, true);
}